

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::doAddCol(SPxLPBase<double> *this,LPColBase<double> *col,bool scale)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  double *pdVar5;
  int iVar6;
  Item *pIVar7;
  ulong uVar8;
  double dVar9;
  int local_88;
  int idx;
  double val;
  LPRowBase<double> empty;
  
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  idx = iVar1;
  LPColSetBase<double>::add(&this->super_LPColSetBase<double>,col);
  if (this->thesense != MAXIMIZE) {
    pdVar3 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3[iVar1] = -pdVar3[iVar1];
  }
  pIVar7 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
           (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar1].idx;
  local_88 = 0;
  if (scale) {
    local_88 = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,pIVar7,&(this->super_LPRowSetBase<double>).scaleExp);
    dVar9 = (this->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    pdVar5 = (double *)infinity();
    if (dVar9 < *pdVar5) {
      dVar9 = ldexp((this->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1],-local_88);
      (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar1] = dVar9;
    }
    dVar9 = (this->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar9) {
      dVar9 = ldexp((this->super_LPColSetBase<double>).low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1],-local_88);
      (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar1] = dVar9;
    }
    dVar9 = ldexp((this->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1],local_88);
    (this->super_LPColSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar1] = dVar9;
    (this->super_LPColSetBase<double>).scaleExp.data[iVar1] = local_88;
  }
  uVar8 = (ulong)(uint)(pIVar7->data).super_SVectorBase<double>.memused;
  while (0 < (int)uVar8) {
    uVar8 = uVar8 - 1;
    pNVar4 = (pIVar7->data).super_SVectorBase<double>.m_elem;
    iVar1 = pNVar4[uVar8].idx;
    dVar9 = pNVar4[uVar8].val;
    if (scale) {
      dVar9 = ldexp(dVar9,(this->super_LPRowSetBase<double>).scaleExp.data[iVar1] + local_88);
      (pIVar7->data).super_SVectorBase<double>.m_elem[uVar8].val = dVar9;
    }
    val = dVar9;
    if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar1) {
      LPRowBase<double>::LPRowBase(&empty,0);
      for (iVar6 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          iVar6 <= iVar1; iVar6 = iVar6 + 1) {
        LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&empty);
      }
      DSVectorBase<double>::~DSVectorBase(&empty.vec);
    }
    LPRowSetBase<double>::add2(&this->super_LPRowSetBase<double>,iVar1,1,&idx,&val);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar2));
  return;
}

Assistant:

void doAddCol(const LPColBase<R>& col, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(col);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      SVectorBase<R>& vec = colVector_w(idx);

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new column and existing row scaling factors to new values in ColSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }